

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O0

void FreeUserData(WebData wdata)

{
  int iVar1;
  void *in_RDI;
  int ngrp;
  int i;
  int local_c;
  
  iVar1 = *(int *)((long)in_RDI + 0x58);
  for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
    SUNDlsMat_destroyMat(*(undefined8 *)((long)in_RDI + (long)local_c * 8));
    SUNDlsMat_destroyArray(*(undefined8 *)((long)in_RDI + (long)local_c * 8 + 0x20));
  }
  N_VDestroy(*(undefined8 *)((long)in_RDI + 0x9928));
  N_VDestroy(*(undefined8 *)((long)in_RDI + 0x9930));
  free(in_RDI);
  return;
}

Assistant:

static void FreeUserData(WebData wdata)
{
  int i, ngrp;

  ngrp = wdata->ngrp;
  for (i = 0; i < ngrp; i++)
  {
    SUNDlsMat_destroyMat((wdata->P)[i]);
    SUNDlsMat_destroyArray((wdata->pivot)[i]);
  }
  N_VDestroy(wdata->rewt);
  N_VDestroy(wdata->vtemp);
  free(wdata);
}